

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_storage.cpp
# Opt level: O0

uint ChannelsFromFmt(FmtChannels chans,uint ambiorder)

{
  uint ambiorder_local;
  FmtChannels chans_local;
  uint local_4;
  
  switch(chans) {
  case FmtMono:
    local_4 = 1;
    break;
  case FmtStereo:
    local_4 = 2;
    break;
  case FmtRear:
    local_4 = 2;
    break;
  case FmtQuad:
    local_4 = 4;
    break;
  case FmtX51:
    local_4 = 6;
    break;
  case FmtX61:
    local_4 = 7;
    break;
  case FmtX71:
    local_4 = 8;
    break;
  case FmtBFormat2D:
    local_4 = ambiorder * 2 + 1;
    break;
  case FmtBFormat3D:
    local_4 = (ambiorder + 1) * (ambiorder + 1);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint ChannelsFromFmt(FmtChannels chans, uint ambiorder) noexcept
{
    switch(chans)
    {
    case FmtMono: return 1;
    case FmtStereo: return 2;
    case FmtRear: return 2;
    case FmtQuad: return 4;
    case FmtX51: return 6;
    case FmtX61: return 7;
    case FmtX71: return 8;
    case FmtBFormat2D: return (ambiorder*2) + 1;
    case FmtBFormat3D: return (ambiorder+1) * (ambiorder+1);
    }
    return 0;
}